

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value_type_info.hpp
# Opt level: O0

vector<person,_std::allocator<person>_> *
lightconf::value_type_info<std::vector<person,_std::allocator<person>_>_>::extract_value
          (vector<person,_std::allocator<person>_> *__return_storage_ptr__,value *val)

{
  bool bVar1;
  return_type<std::vector<lightconf::value>_> this;
  return_type<person> local_c8;
  reference local_58;
  value *u;
  const_iterator __end2;
  const_iterator __begin2;
  value_vector_type *__range2;
  value_vector_type *inner_vals;
  value *val_local;
  vector<person,_std::allocator<person>_> *v;
  
  std::vector<person,_std::allocator<person>_>::vector(__return_storage_ptr__);
  this = value::get<std::vector<lightconf::value,std::allocator<lightconf::value>>>(val);
  __end2 = std::vector<lightconf::value,_std::allocator<lightconf::value>_>::begin(this);
  u = (value *)std::vector<lightconf::value,_std::allocator<lightconf::value>_>::end(this);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end2,(__normal_iterator<const_lightconf::value_*,_std::vector<lightconf::value,_std::allocator<lightconf::value>_>_>
                                     *)&u), bVar1) {
    local_58 = __gnu_cxx::
               __normal_iterator<const_lightconf::value_*,_std::vector<lightconf::value,_std::allocator<lightconf::value>_>_>
               ::operator*(&__end2);
    value::get<person>(&local_c8,local_58);
    std::vector<person,_std::allocator<person>_>::push_back(__return_storage_ptr__,&local_c8);
    person::~person(&local_c8);
    __gnu_cxx::
    __normal_iterator<const_lightconf::value_*,_std::vector<lightconf::value,_std::allocator<lightconf::value>_>_>
    ::operator++(&__end2);
  }
  return __return_storage_ptr__;
}

Assistant:

static std::vector<U> extract_value(const value& val) {
        std::vector<U> v;
        const value_vector_type& inner_vals = val.get<value_vector_type>();
        for (const auto& u : inner_vals) {
            v.push_back(u.get<U>());
        }
        return v;
    }